

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YinYang.cpp
# Opt level: O0

double __thiscall YinYang::coordinateY(YinYang *this,int J,int K,int L,int G)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int G_local;
  int L_local;
  int K_local;
  int J_local;
  YinYang *this_local;
  
  if (G == 0) {
    this->theta1 = (double)J * this->d_theta1 + this->theta1_lb;
    this->theta2 = (double)K * this->d_theta2 + this->theta2_lb;
    dVar1 = (this->super_Parameterization).radius;
    dVar2 = sin(this->theta2);
    dVar3 = cos(this->theta1);
    (this->super_Parameterization).y = dVar1 * dVar2 * dVar3;
  }
  else if (G == 1) {
    this->theta1 = (double)J * this->d_theta1 + this->theta1_lb;
    this->theta2 = (double)K * this->d_theta2 + this->theta2_lb;
    dVar1 = (this->super_Parameterization).radius;
    dVar2 = sin(this->theta2);
    dVar3 = cos(this->theta1);
    (this->super_Parameterization).y = -dVar1 * dVar2 * dVar3;
  }
  return (this->super_Parameterization).y;
}

Assistant:

double YinYang::coordinateY(int J, int K, int L, int G) {
  switch (G) {
    case 0:  // Yin
      theta1 = theta1_lb + (double)J * d_theta1;
      theta2 = theta2_lb + (double)K * d_theta2;
      y = radius * sin(theta2) * cos(theta1);
      break;
    case 1:  // Yang
      theta1 = theta1_lb + (double)J * d_theta1;
      theta2 = theta2_lb + (double)K * d_theta2;
      //y = radius * cos(theta2);
      y = -radius * sin(theta2) * cos(theta1);
      break;
  }

  return y;
}